

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_database_window.cpp
# Opt level: O2

void ModelDbWindow::render(registry *p_reg)

{
  undefined8 uVar1;
  key_type *pkVar2;
  bool bVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  Texture *p_texture_id;
  key_type *__k;
  long *plVar6;
  long *local_b40;
  ImVec2 local_b30;
  ImVec2 local_b28;
  ImVec2 local_b20;
  ImVec4 local_b18;
  ImVec4 local_b08 [2];
  ostringstream modeldata_ostr;
  float fStack_ae4;
  ostream local_ad8 [376];
  stringstream ostr_texture_gl_id;
  undefined1 local_950 [376];
  stringstream m_vertices_ostr;
  undefined1 local_7c8 [376];
  stringstream m_indices_ostr;
  undefined1 local_640 [376];
  stringstream ostr_texture_size;
  undefined1 local_4b8 [376];
  stringstream ostr_texture_type;
  ostream local_330 [376];
  stringstream ostr_texture_path;
  ostream local_1a8 [376];
  
  ImGui::Begin("Model Database",(bool *)0x0,0);
  bVar3 = ImGui::CollapsingHeader("Load Models",0);
  if (bVar3) {
    ImGui::InputText("path:",render::model_path_text,0x40,0,(ImGuiInputTextCallback)0x0,(void *)0x0)
    ;
    _modeldata_ostr = 0.0;
    fStack_ae4 = 0.0;
    bVar3 = ImGui::Button("Load Model",(ImVec2 *)&modeldata_ostr);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&modeldata_ostr,render::model_path_text,
                 (allocator<char> *)&m_vertices_ostr);
      ModelDb::add_model_job((string *)&modeldata_ostr);
      std::__cxx11::string::~string((string *)&modeldata_ostr);
    }
  }
  bVar3 = ImGui::CollapsingHeader("Models List",0);
  if (bVar3) {
    plVar6 = (long *)(ModelDb::map + 0x10);
    while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&modeldata_ostr);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&modeldata_ostr);
      std::operator<<(poVar4," : ");
      std::operator<<((ostream *)&modeldata_ostr,(string *)(plVar6 + 2));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modeldata_ostr);
    }
  }
  bVar3 = ImGui::CollapsingHeader("Meshes List",0);
  if (bVar3) {
    local_b40 = (long *)(MeshDb::map + 0x10);
    while (local_b40 = (long *)*local_b40, local_b40 != (long *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&modeldata_ostr);
      std::operator<<(local_ad8,"m_vao_id: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_ad8);
      std::__cxx11::stringbuf::str();
      bVar3 = ImGui::TreeNode(_m_vertices_ostr);
      std::__cxx11::string::~string((string *)&m_vertices_ostr);
      if (bVar3) {
        std::__cxx11::stringstream::stringstream((stringstream *)&m_vertices_ostr);
        std::ostream::_M_insert<unsigned_long>((ulong)local_7c8);
        std::__cxx11::stringbuf::str();
        ImGui::Text("vertices count: %s",_m_indices_ostr);
        std::__cxx11::string::~string((string *)&m_indices_ostr);
        std::__cxx11::stringstream::stringstream((stringstream *)&m_indices_ostr);
        std::ostream::_M_insert<unsigned_long>((ulong)local_640);
        std::__cxx11::stringbuf::str();
        ImGui::Text("indices count: %s",_ostr_texture_gl_id);
        std::__cxx11::string::~string((string *)&ostr_texture_gl_id);
        bVar3 = ImGui::TreeNode("Textures:");
        if (bVar3) {
          pkVar2 = (key_type *)local_b40[0xb];
          for (__k = (key_type *)local_b40[10]; __k != pkVar2; __k = __k + 2) {
            pmVar5 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_TextureInfo>,_std::allocator<std::pair<const_unsigned_int,_TextureInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_TextureInfo>,_std::allocator<std::pair<const_unsigned_int,_TextureInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)TextureDb::map,__k);
            std::__cxx11::stringstream::stringstream((stringstream *)&ostr_texture_gl_id);
            std::ostream::_M_insert<unsigned_long>((ulong)local_950);
            std::__cxx11::stringbuf::str();
            ImGui::Text("id: %s",_ostr_texture_path);
            std::__cxx11::string::~string((string *)&ostr_texture_path);
            std::__cxx11::stringstream::stringstream((stringstream *)&ostr_texture_path);
            std::operator<<(local_1a8,(string *)&pmVar5->m_path);
            std::__cxx11::stringbuf::str();
            ImGui::Text("path: %s",_ostr_texture_type);
            std::__cxx11::string::~string((string *)&ostr_texture_type);
            std::__cxx11::stringstream::stringstream((stringstream *)&ostr_texture_type);
            ::operator<<(local_330,pmVar5->m_type);
            std::__cxx11::stringbuf::str();
            ImGui::Text("type: %s",_ostr_texture_size);
            std::__cxx11::string::~string((string *)&ostr_texture_size);
            std::__cxx11::stringstream::stringstream((stringstream *)&ostr_texture_size);
            poVar4 = (ostream *)
                     std::ostream::operator<<(local_4b8,(pmVar5->m_dimension)._M_elems[0]);
            poVar4 = std::operator<<(poVar4," ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pmVar5->m_dimension)._M_elems[1]);
            poVar4 = std::operator<<(poVar4,", ");
            std::ostream::operator<<(poVar4,(pmVar5->m_dimension)._M_elems[2]);
            std::__cxx11::stringbuf::str();
            ImGui::Text("dimension: %s",local_b08[0]._0_8_);
            std::__cxx11::string::~string((string *)local_b08);
            uVar1 = *(undefined8 *)(pmVar5->m_dimension)._M_elems;
            local_b28.x = 0.0;
            local_b28.y = 0.0;
            local_b20.y = (float)(int)((ulong)uVar1 >> 0x20);
            local_b20.x = (float)(int)uVar1;
            local_b30.x = 1.0;
            local_b30.y = 1.0;
            local_b08[0].x = 1.0;
            local_b08[0].y = 1.0;
            local_b08[0].z = 1.0;
            local_b08[0].w = 1.0;
            local_b18.x = 0.0;
            local_b18.y = 0.0;
            local_b18.z = 0.0;
            local_b18.w = 0.0;
            ImGui::Image((ImTextureID)(ulong)pmVar5->m_gl_id,&local_b20,&local_b28,&local_b30,
                         local_b08,&local_b18);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ostr_texture_size);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ostr_texture_type);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ostr_texture_path);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ostr_texture_gl_id);
          }
          ImGui::TreePop();
        }
        ImGui::TreePop();
        std::__cxx11::stringstream::~stringstream((stringstream *)&m_indices_ostr);
        std::__cxx11::stringstream::~stringstream((stringstream *)&m_vertices_ostr);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&modeldata_ostr);
    }
  }
  ImGui::End();
  return;
}

Assistant:

void ModelDbWindow::render(
    entt::registry &p_reg) noexcept // We will use this to list users of ModelInfo
{
    ImGui::Begin("Model Database");
    if (ImGui::CollapsingHeader("Load Models"))
    {
        static char model_path_text[64] = "";
        ImGui::InputText("path:", model_path_text, 64);
        if (ImGui::Button("Load Model"))
        {
            ModelDb::add_model_job(
                std::string(model_path_text));
        }
    }
    if (ImGui::CollapsingHeader("Models List"))
    {
        for (const auto &p_modeldata_iter : ModelDb::map)
        {
            std::ostringstream modeldata_ostr;
            modeldata_ostr << p_modeldata_iter.first << " : ";
            modeldata_ostr << p_modeldata_iter.second.m_path;
        };
    }

    if (ImGui::CollapsingHeader("Meshes List"))
    {
        for (const std::pair<const std::size_t, Mesh> &mesh_iter : MeshDb::map)
        {
            const Mesh &mesh = mesh_iter.second;
            std::stringstream vao_id_ostr;
            vao_id_ostr << "m_vao_id: ";
            vao_id_ostr << mesh.m_vao_id;
            if (ImGui::TreeNode(vao_id_ostr.str().c_str()))
            {
                std::stringstream m_vertices_ostr;
                m_vertices_ostr << mesh.m_vertices.size();
                ImGui::Text("vertices count: %s", m_vertices_ostr.str().c_str());
                std::stringstream m_indices_ostr;
                m_indices_ostr << mesh.m_indices.size();
                ImGui::Text("indices count: %s", m_indices_ostr.str().c_str());
                if (ImGui::TreeNode("Textures:"))
                {
                    for (const Texture &p_texture_id : mesh.m_textures)
                    {
                        // TODO :: Refactor a bunch of this
                        const TextureInfo &texture_data = TextureDb::map.at(p_texture_id.m_gl_id);
                        std::stringstream ostr_texture_gl_id;
                        ostr_texture_gl_id << texture_data.m_gl_id;
                        ImGui::Text("id: %s", ostr_texture_gl_id.str().c_str());

                        std::stringstream ostr_texture_path;
                        ostr_texture_path << texture_data.m_path;
                        ImGui::Text("path: %s", ostr_texture_path.str().c_str());

                        std::stringstream ostr_texture_type;
                        ostr_texture_type << texture_data.m_type;
                        ImGui::Text("type: %s", ostr_texture_type.str().c_str());

                        std::stringstream ostr_texture_size;
                        ostr_texture_size << texture_data.m_dimension[0] << " " << texture_data.m_dimension[1] << ", " << texture_data.m_dimension[2];
                        ImGui::Text("dimension: %s", ostr_texture_size.str().c_str());

                        // TODO :: Figure out how to resize the image properly, maintaing its aspect ratio etc etc
                        ImGui::Image(
                            (ImTextureID)(intptr_t)texture_data.m_gl_id,
                            ImVec2(
                                static_cast<float>(texture_data.m_dimension[0]),
                                static_cast<float>(texture_data.m_dimension[1])));
                    };
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }
        };
    }
    ImGui::End();
}